

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamToolsIndex::HasAlignments(BamToolsIndex *this,int *referenceID)

{
  size_type sVar1;
  const_reference pvVar2;
  int *in_RSI;
  long in_RDI;
  BtiReferenceSummary *refSummary;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  
  if (-1 < *in_RSI) {
    iVar3 = *in_RSI;
    sVar1 = std::
            vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
            ::size((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                    *)(in_RDI + 0x38));
    if (iVar3 < (int)sVar1) {
      pvVar2 = std::
               vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
               ::at((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                     *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      return 0 < pvVar2->NumBlocks;
    }
  }
  return false;
}

Assistant:

bool BamToolsIndex::HasAlignments(const int& referenceID) const
{
    if (referenceID < 0 || referenceID >= (int)m_indexFileSummary.size()) return false;
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(referenceID);
    return (refSummary.NumBlocks > 0);
}